

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O0

vector<bool,_std::allocator<bool>_> *
cppnet::any_cast<std::vector<bool,std::allocator<bool>>>(Any *operand)

{
  bool bVar1;
  type_info *this;
  Any *operand_local;
  
  if (operand != (Any *)0x0) {
    this = Any::Type(operand);
    bVar1 = std::type_info::operator==
                      (this,(type_info *)&std::vector<bool,std::allocator<bool>>::typeinfo);
    if (bVar1) {
      return (vector<bool,_std::allocator<bool>_> *)(operand->_content + 1);
    }
  }
  return (vector<bool,_std::allocator<bool>_> *)0x0;
}

Assistant:

ValueType* any_cast(Any * operand)  {
    if (operand && operand->Type() == typeid(ValueType)) {
        return &static_cast<Any::CHolder<ValueType> *>(operand->_content)->_held;
    }
    return nullptr;
}